

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_done(uv__work *w,int status)

{
  _func_void_uv__work_ptr *p_Var1;
  _func_void_uv__work_ptr_int *p_Var2;
  undefined8 in_RAX;
  undefined4 in_register_00000034;
  
  if ((w[-7].loop)->active_reqs == (void **)(w[-7].loop)->active_reqs[0]) {
    __assert_fail("uv__has_active_reqs(req->loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                  ,0x3e3,"void uv__fs_done(struct uv__work *, int)");
  }
  p_Var1 = w[-8].work;
  *(_func_void_uv__work_ptr **)w[-8].done = p_Var1;
  p_Var2 = w[-8].done;
  *(_func_void_uv__work_ptr_int **)(p_Var1 + 8) = p_Var2;
  if (status == -0x7d) {
    if (w[-7].wq[1] != (void *)0x0) {
      __assert_fail("req->result == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/fs.c"
                    ,0x3e6,"void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq[1] = (void *)0xffffffffffffff83;
  }
  (*(code *)w[-7].wq[0])(w[-9].wq,CONCAT44(in_register_00000034,status),p_Var2,in_RAX);
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == UV_ECANCELED) {
    assert(req->result == 0);
    req->result = UV_ECANCELED;
  }

  req->cb(req);
}